

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t roaring_bitmap_range_cardinality_closed
                   (roaring_bitmap_t *r,uint32_t range_start,uint32_t range_end)

{
  ushort uVar1;
  ushort uVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  uint in_EDX;
  uint in_ESI;
  int *in_RDI;
  uint16_t key;
  int i;
  uint64_t card;
  uint16_t maxhb;
  uint16_t minhb;
  roaring_array_t *ra;
  undefined2 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffca;
  undefined4 in_stack_ffffffffffffffcc;
  uint64_t local_30;
  uint64_t local_8;
  
  if (in_EDX < in_ESI) {
    local_8 = 0;
  }
  else {
    uVar2 = (ushort)(in_EDX >> 0x10);
    local_30 = 0;
    iVar3 = ra_get_index((roaring_array_t *)
                         CONCAT44(in_stack_ffffffffffffffcc,
                                  CONCAT22(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8)),0);
    if (iVar3 < 0) {
      iVar4 = -1 - iVar3;
    }
    else {
      if ((ushort)(in_ESI >> 0x10) == uVar2) {
        iVar4 = container_rank((container_t *)
                               CONCAT44(iVar3,CONCAT22(in_stack_ffffffffffffffca,
                                                       in_stack_ffffffffffffffc8)),'\0',0);
      }
      else {
        iVar4 = container_get_cardinality
                          ((container_t *)
                           CONCAT44(iVar3,CONCAT22(in_stack_ffffffffffffffca,
                                                   in_stack_ffffffffffffffc8)),'\0');
      }
      local_30 = (uint64_t)iVar4;
      if ((in_ESI & 0xffff) != 0) {
        iVar4 = container_rank((container_t *)
                               CONCAT44(iVar3,CONCAT22(in_stack_ffffffffffffffca,
                                                       in_stack_ffffffffffffffc8)),'\0',0);
        local_30 = local_30 - (long)iVar4;
      }
      iVar4 = iVar3 + 1;
    }
    for (; iVar4 < *in_RDI; iVar4 = iVar4 + 1) {
      uVar1 = *(ushort *)(*(long *)(in_RDI + 4) + (long)iVar4 * 2);
      if (uVar2 <= uVar1) {
        if (uVar1 == uVar2) {
          iVar4 = container_rank((container_t *)
                                 CONCAT44(iVar4,CONCAT22(uVar1,in_stack_ffffffffffffffc8)),'\0',0);
          local_30 = (long)iVar4 + local_30;
        }
        break;
      }
      iVar5 = container_get_cardinality
                        ((container_t *)CONCAT44(iVar4,CONCAT22(uVar1,in_stack_ffffffffffffffc8)),
                         '\0');
      local_30 = (long)iVar5 + local_30;
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

uint64_t roaring_bitmap_range_cardinality_closed(const roaring_bitmap_t *r,
                                                 uint32_t range_start,
                                                 uint32_t range_end) {
    const roaring_array_t *ra = &r->high_low_container;

    if (range_start > range_end) {
        return 0;
    }

    // now we have: 0 <= range_start <= range_end <= UINT32_MAX

    uint16_t minhb = (uint16_t)(range_start >> 16);
    uint16_t maxhb = (uint16_t)(range_end >> 16);

    uint64_t card = 0;

    int i = ra_get_index(ra, minhb);
    if (i >= 0) {
        if (minhb == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
        } else {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        }
        if ((range_start & 0xffff) != 0) {
            card -= container_rank(ra->containers[i], ra->typecodes[i],
                                   (range_start & 0xffff) - 1);
        }
        i++;
    } else {
        i = -i - 1;
    }

    for (; i < ra->size; i++) {
        uint16_t key = ra->keys[i];
        if (key < maxhb) {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        } else if (key == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
            break;
        } else {
            break;
        }
    }

    return card;
}